

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  roaring_array_t *in_RDX;
  roaring_array_t *in_RSI;
  uint32_t hb;
  uint16_t lb_end;
  uint16_t hb_end;
  uint16_t lb_start;
  uint16_t hb_start;
  uint local_24;
  ushort local_1e;
  ushort local_1a;
  uint16_t lb_end_00;
  uint16_t lb_start_00;
  uint16_t hb_00;
  
  if (in_RSI < in_RDX) {
    if ((roaring_array_t *)0xffffffff < in_RDX) {
      in_RDX = (roaring_array_t *)0x100000000;
    }
    local_1a = (ushort)((ulong)in_RSI >> 0x10);
    local_1e = (ushort)((ulong)&in_RDX[-1].field_0x27 >> 0x10);
    lb_end_00 = (uint16_t)((ulong)in_RDX >> 0x10);
    lb_start_00 = (uint16_t)((ulong)in_RDX >> 0x20);
    hb_00 = (uint16_t)((ulong)in_RDX >> 0x30);
    if (local_1a == local_1e) {
      inplace_flip_container(in_RSI,hb_00,lb_start_00,lb_end_00);
    }
    else {
      if ((short)in_RSI != 0) {
        inplace_flip_container(in_RSI,hb_00,lb_start_00,lb_end_00);
        local_1a = local_1a + 1;
      }
      if ((short)in_RDX != 0) {
        local_1e = local_1e - 1;
      }
      for (local_24 = (uint)local_1a; local_24 <= local_1e; local_24 = local_24 + 1) {
        inplace_fully_flip_container(in_RSI,hb_00);
      }
      if ((short)in_RDX != 0) {
        inplace_flip_container(in_RSI,hb_00,lb_start_00,lb_end_00);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}